

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileLog.cpp
# Opt level: O2

void __thiscall FIX::FileLog::~FileLog(FileLog *this)

{
  ~FileLog(this);
  operator_delete(this,0x488);
  return;
}

Assistant:

FileLog::~FileLog()
{
  m_messages.close();
  m_event.close();
}